

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O2

void __thiscall Multi_Field_properties::test_method(Multi_Field_properties *this)

{
  char *pcStack_330;
  char *pcStack_328;
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> aMStack_320 [2];
  undefined8 uStack_318;
  shared_count sStack_310;
  Element_conflict EStack_304;
  undefined **ppuStack_300;
  undefined1 uStack_2f8;
  undefined8 *puStack_2f0;
  char **ppcStack_2e8;
  Element_conflict EStack_2dc;
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> MStack_2d8;
  int iStack_2d4;
  char *pcStack_2d0;
  char *pcStack_2c8;
  char *pcStack_2c0;
  char *pcStack_2b8;
  char *pcStack_2b0;
  char *pcStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  char *pcStack_288;
  undefined1 *puStack_280;
  undefined1 *puStack_278;
  char *pcStack_270;
  char *pcStack_268;
  char *pcStack_260;
  char *pcStack_258;
  undefined1 *puStack_250;
  undefined1 *puStack_248;
  char *pcStack_240;
  char *pcStack_238;
  char *pcStack_230;
  char *pcStack_228;
  undefined1 *puStack_220;
  undefined1 *puStack_218;
  char *pcStack_210;
  char *pcStack_208;
  char *pcStack_200;
  char *pcStack_1f8;
  undefined1 *puStack_1f0;
  undefined1 *puStack_1e8;
  char *pcStack_1e0;
  char *pcStack_1d8;
  undefined1 *puStack_1d0;
  undefined1 *puStack_1c8;
  char *pcStack_1c0;
  char *pcStack_1b8;
  undefined1 *puStack_1b0;
  undefined1 *puStack_1a8;
  char *pcStack_1a0;
  char *pcStack_198;
  char *pcStack_190;
  char *pcStack_188;
  undefined1 *puStack_180;
  undefined1 *puStack_178;
  char *pcStack_170;
  char *pcStack_168;
  char *pcStack_160;
  char *pcStack_158;
  undefined1 *puStack_150;
  undefined1 *puStack_148;
  char *pcStack_140;
  char *pcStack_138;
  char *pcStack_130;
  char *pcStack_128;
  undefined1 *puStack_120;
  undefined1 *puStack_118;
  char *pcStack_110;
  char *pcStack_108;
  char *pcStack_100;
  char *pcStack_f8;
  undefined1 *puStack_f0;
  undefined1 *puStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  char *pcStack_d0;
  char *pcStack_c8;
  undefined1 *puStack_c0;
  undefined1 *puStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *pcStack_98;
  undefined1 *puStack_90;
  undefined1 *puStack_88;
  char *pcStack_80;
  char *pcStack_78;
  undefined1 *puStack_70;
  undefined1 *puStack_68;
  char *pcStack_60;
  char *pcStack_58;
  undefined1 *puStack_50;
  undefined1 *puStack_48;
  char *pcStack_40;
  char *pcStack_38;
  
  EStack_2dc = 1;
  EStack_304 = 7;
  pcStack_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_38 = "";
  puStack_50 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_40,0x1c2);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_298 = "";
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_inverse
            (aMStack_320);
  pcStack_330._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_2a0,0x1c2,1,2,aMStack_320,"m1.get_inverse()",&pcStack_330,"T(1)"
            );
  pcStack_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_58 = "";
  puStack_70 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_60,0x1c3);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_2a8 = "";
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_inverse
            (aMStack_320);
  pcStack_330 = (char *)CONCAT44(pcStack_330._4_4_,0xac6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_2b0,0x1c3,1,2,aMStack_320,"m2.get_inverse()",&pcStack_330,
             "T(2758)");
  pcStack_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_78 = "";
  puStack_90 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_80,0x1c4);
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_partial_inverse
            (&MStack_2d8,(Characteristic)&EStack_2dc);
  uStack_318 = 0;
  sStack_310.pi_ = (sp_counted_base *)0x0;
  pcStack_330 = "m1.get_partial_inverse(35) == std::make_pair(MF(1716), T(35))";
  pcStack_328 = "";
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129be8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  pcStack_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_98 = "";
  ppcStack_2e8 = &pcStack_330;
  aMStack_320[0].element_._0_1_ = iStack_2d4 == 0x23 && MStack_2d8.element_ == 0x6b4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_310);
  pcStack_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_a8 = "";
  puStack_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_b0,0x1c5);
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::get_partial_inverse
            (&MStack_2d8,(Characteristic)&EStack_304);
  aMStack_320[0].element_._0_1_ = iStack_2d4 == 5 && MStack_2d8.element_ == 0xbbb;
  uStack_318 = 0;
  sStack_310.pi_ = (sp_counted_base *)0x0;
  pcStack_330 = "m2.get_partial_inverse(35) == std::make_pair(MF(3003), T(5))";
  pcStack_328 = "";
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129be8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = &pcStack_330;
  pcStack_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_c8 = "";
  boost::test_tools::tt_detail::report_assertion(aMStack_320,&ppuStack_300,&pcStack_d0,0x1c5,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_310);
  pcStack_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_d8 = "";
  puStack_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_e0,0x1c7);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_f8 = "";
  aMStack_320[0].element_ = 0;
  pcStack_330 = (char *)((ulong)pcStack_330 & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_100,0x1c7,1,2,aMStack_320,"m1.get_additive_identity()",
             &pcStack_330,"T(0)");
  pcStack_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_108 = "";
  puStack_120 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_110,0x1c8);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  aMStack_320[0].element_ = 0;
  pcStack_128 = "";
  pcStack_330 = (char *)((ulong)pcStack_330 & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_130,0x1c8,1,2,aMStack_320,"m2.get_additive_identity()",
             &pcStack_330,"T(0)");
  pcStack_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_138 = "";
  puStack_150 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_140,0x1c9);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_158 = "";
  pcStack_330._0_4_ = 1;
  aMStack_320[0].element_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_160,0x1c9,1,2,aMStack_320,"m1.get_multiplicative_identity()",
             &pcStack_330,"T(1)");
  pcStack_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_168 = "";
  puStack_180 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_170,0x1ca);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_188 = "";
  pcStack_330._0_4_ = 1;
  aMStack_320[0].element_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_190,0x1ca,1,2,aMStack_320,"m2.get_multiplicative_identity()",
             &pcStack_330,"T(1)");
  pcStack_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_198 = "";
  puStack_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1a0,0x1cb);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_2b8 = "";
  pcStack_330._0_4_ = 7;
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::
  get_partial_multiplicative_identity(aMStack_320,(Characteristic *)&pcStack_330);
  MStack_2d8.element_ = 0x2cb;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_2c0,0x1cb,1,2,aMStack_320,
             "m1.get_partial_multiplicative_identity(7)",&MStack_2d8,"T(715)");
  pcStack_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_1b8 = "";
  puStack_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1c0,0x1cc);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_2c8 = "";
  pcStack_330._0_4_ = 7;
  Gudhi::persistence_fields::
  Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::
  get_partial_multiplicative_identity(aMStack_320,(Characteristic *)&pcStack_330);
  MStack_2d8.element_ = 0x2cb;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>,unsigned_int>
            (&ppuStack_300,&pcStack_2d0,0x1cc,1,2,aMStack_320,
             "m2.get_partial_multiplicative_identity(7)",&MStack_2d8,"T(715)");
  pcStack_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_1d8 = "";
  puStack_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_1e0,0x1ce);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_1f8 = "";
  aMStack_320[0].element_ = 0x138d;
  pcStack_330._0_4_ = 0x138d;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&ppuStack_300,&pcStack_200,0x1ce,1,2,aMStack_320,"m1.get_characteristic()",&pcStack_330
             ,"5005");
  pcStack_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_208 = "";
  puStack_220 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_210,0x1cf);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_228 = "";
  aMStack_320[0].element_ = 0x138d;
  pcStack_330._0_4_ = 0x138d;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&ppuStack_300,&pcStack_230,0x1cf,1,2,aMStack_320,"m2.get_characteristic()",&pcStack_330
             ,"5005");
  pcStack_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_238 = "";
  puStack_250 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_240,0x1d1);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_258 = "";
  aMStack_320[0].element_ = EStack_2dc;
  pcStack_330._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&ppuStack_300,&pcStack_260,0x1d1,1,2,aMStack_320,"m1.get_value()",&pcStack_330,"1");
  pcStack_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_268 = "";
  puStack_280 = &boost::unit_test::basic_cstring<char_const>::null;
  puStack_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&pcStack_270,0x1d2);
  uStack_2f8 = 0;
  ppuStack_300 = &PTR__lazy_ostream_00129ae8;
  puStack_2f0 = &boost::unit_test::lazy_ostream::inst;
  ppcStack_2e8 = (char **)0x11e044;
  pcStack_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  pcStack_288 = "";
  aMStack_320[0].element_ = EStack_304;
  pcStack_330 = (char *)CONCAT44(pcStack_330._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&ppuStack_300,&pcStack_290,0x1d2,1,2,aMStack_320,"m2.get_value()",&pcStack_330,"7");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Multi_Field_properties) {
  test_multi_field_properties<Multi_field_element_with_small_characteristics<5, 13> >();
#ifdef PM_GMP_FOUND
  test_multi_field_properties<Multi_field_element<5, 13> >();

  Multi_field_element<3, 30> mb1(2);
  Multi_field_element_with_small_characteristics<3, 30> mb2(2);

  BOOST_CHECK_EQUAL(mb1.get_characteristic(), mb2.get_characteristic());  // == 3234846615
  BOOST_CHECK_EQUAL(mb1.get_partial_inverse(35).first.get_value(),
                    mb2.get_partial_inverse(35).first.get_value());  // == 2033332158
#endif
}